

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::Subcase::~Subcase(Subcase *this)

{
  IReporter *pIVar1;
  bool bVar2;
  int iVar3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *pvVar4;
  reference ppIVar5;
  IReporter **curr_rep_1;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  bool local_48;
  reference local_40;
  IReporter **curr_rep;
  iterator __end4;
  iterator __begin4;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range4;
  Subcase *this_local;
  
  if ((this->m_entered & 1U) != 0) {
    if ((*(byte *)(g_cs + 0x1164) & 1) == 0) {
      std::
      set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
      ::insert((set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
                *)(g_cs + 0x1130),(value_type *)(g_cs + 0x1118));
    }
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::pop_back
              ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
               (g_cs + 0x1118));
    iVar3 = std::uncaught_exceptions();
    if ((0 < iVar3) &&
       (bVar2 = std::atomic::operator_cast_to_bool((atomic *)(g_cs + 0x1165)), bVar2)) {
      pvVar4 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
               (g_cs + 0x10d8);
      __end4 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                         (pvVar4);
      curr_rep = (IReporter **)
                 std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                           (pvVar4);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                         *)&curr_rep), bVar2) {
        local_40 = __gnu_cxx::
                   __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                   ::operator*(&__end4);
        pIVar1 = *local_40;
        String::String((String *)&__range3,
                       "exception thrown in subcase - will translate later when the whole test case has been exited (cannot translate while there is an active exception)"
                      );
        local_48 = false;
        (*pIVar1->_vptr_IReporter[6])(pIVar1,&__range3);
        TestCaseException::~TestCaseException((TestCaseException *)&__range3);
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&__end4);
      }
      std::atomic<bool>::operator=((atomic<bool> *)(g_cs + 0x1165),false);
    }
    pvVar4 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)(g_cs + 0x10d8);
    __end3 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin(pvVar4)
    ;
    curr_rep_1 = (IReporter **)
                 std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                           (pvVar4);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                       *)&curr_rep_1), bVar2) {
      ppIVar5 = __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator*(&__end3);
      (*(*ppIVar5)->_vptr_IReporter[8])();
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&__end3);
    }
  }
  SubcaseSignature::~SubcaseSignature(&this->m_signature);
  return;
}

Assistant:

Subcase::~Subcase() {
        if(m_entered) {
            // only mark the subcase stack as passed if no subcases have been skipped
            if(g_cs->should_reenter == false)
                g_cs->subcasesPassed.insert(g_cs->subcasesStack);
            g_cs->subcasesStack.pop_back();

#if defined(__cpp_lib_uncaught_exceptions) && __cpp_lib_uncaught_exceptions >= 201411L && (!defined(__MAC_OS_X_VERSION_MIN_REQUIRED) || __MAC_OS_X_VERSION_MIN_REQUIRED >= 101200)
            if(std::uncaught_exceptions() > 0
#else
            if(std::uncaught_exception()
#endif
            && g_cs->shouldLogCurrentException) {
                DOCTEST_ITERATE_THROUGH_REPORTERS(
                        test_case_exception, {"exception thrown in subcase - will translate later "
                                              "when the whole test case has been exited (cannot "
                                              "translate while there is an active exception)",
                                              false});
                g_cs->shouldLogCurrentException = false;
            }
            DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_end, DOCTEST_EMPTY);
        }
    }